

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O0

void google::ShowVersion(void)

{
  FILE *__stream;
  char *pcVar1;
  char *pcVar2;
  char *version_string;
  
  pcVar1 = VersionString();
  __stream = _stdout;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    pcVar1 = ProgramInvocationShortName();
    fprintf(__stream,"%s\n",pcVar1);
  }
  else {
    pcVar2 = ProgramInvocationShortName();
    fprintf(__stream,"%s version %s\n",pcVar2,pcVar1);
  }
  fprintf(_stdout,"Debug build (NDEBUG not #defined)\n");
  return;
}

Assistant:

static void ShowVersion() {
  const char* version_string = VersionString();
  if (version_string && *version_string) {
    fprintf(stdout, "%s version %s\n",
            ProgramInvocationShortName(), version_string);
  } else {
    fprintf(stdout, "%s\n", ProgramInvocationShortName());
  }
# if !defined(NDEBUG)
  fprintf(stdout, "Debug build (NDEBUG not #defined)\n");
# endif
}